

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printRegImmShift(MCInst *MI,SStream *O,ARM_AM_ShiftOpc ShOpc,uint ShImm)

{
  cs_detail *pcVar1;
  char *s;
  ulong uVar2;
  
  if ((ShOpc != ARM_AM_no_shift) && (ShOpc != ARM_AM_lsl || ShImm != 0)) {
    SStream_concat0(O,", ");
    s = ARM_AM_getShiftOpcStr(ShOpc);
    SStream_concat0(O,s);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar1 = MI->flat_insn->detail;
      *(ARM_AM_ShiftOpc *)
       ((long)pcVar1 +
       ((ulong)(pcVar1->field_6).arm.op_count - ((ulong)MI->csh->doing_mem ^ 1)) * 0x28 + 0x5c) =
           ShOpc;
    }
    if (ShOpc != ARM_AM_rrx) {
      SStream_concat0(O," ");
      uVar2 = 0x20;
      if (ShImm != 0) {
        uVar2 = (ulong)ShImm;
      }
      SStream_concat(O,"#%u",uVar2);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar1 = MI->flat_insn->detail;
        *(int *)((long)pcVar1 +
                ((ulong)(pcVar1->field_6).arm.op_count - ((ulong)MI->csh->doing_mem ^ 1)) * 0x28 +
                0x60) = (int)uVar2;
      }
    }
  }
  return;
}

Assistant:

static void printRegImmShift(MCInst *MI, SStream *O, ARM_AM_ShiftOpc ShOpc, unsigned ShImm)
{
	if (ShOpc == ARM_AM_no_shift || (ShOpc == ARM_AM_lsl && !ShImm))
		return;
	SStream_concat0(O, ", ");

	//assert (!(ShOpc == ARM_AM_ror && !ShImm) && "Cannot have ror #0");
	SStream_concat0(O, ARM_AM_getShiftOpcStr(ShOpc));
	if (MI->csh->detail) {
		if (MI->csh->doing_mem)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (arm_shifter)ShOpc;
		else
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = (arm_shifter)ShOpc;
	}

	if (ShOpc != ARM_AM_rrx) {
		SStream_concat0(O, " ");
		SStream_concat(O, "#%u", translateShiftImm(ShImm));
		if (MI->csh->detail) {
			if (MI->csh->doing_mem)
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.value = translateShiftImm(ShImm);
			else
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = translateShiftImm(ShImm);
		}
	}
}